

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_double_suite::test_linear_decrease(void)

{
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = 0x4024000000000000;
  local_30 = 0x4024000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xc6,"void mean_double_suite::test_linear_decrease()",&local_38,&local_30);
  local_38 = 0x4023000000000000;
  local_30 = 0x4023000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,200,"void mean_double_suite::test_linear_decrease()",&local_38,&local_30);
  local_38 = 0x4022000000000000;
  local_30 = 0x4022000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xca,"void mean_double_suite::test_linear_decrease()",&local_38,&local_30);
  local_38 = 0x4021000000000000;
  local_30 = 0x4021000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","8.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xcc,"void mean_double_suite::test_linear_decrease()",&local_38,&local_30);
  local_38 = 0x401e000000000000;
  local_30 = 0x401e000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","7.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xce,"void mean_double_suite::test_linear_decrease()",&local_38,&local_30);
  local_38 = 0x401a000000000000;
  local_30 = 0x401a000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","6.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xd0,"void mean_double_suite::test_linear_decrease()",&local_38,&local_30);
  return;
}

Assistant:

void test_linear_decrease()
{
    interim::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(9.0);
    TRIAL_TEST_EQ(filter.mean(), 9.5);
    filter.push(8.0);
    TRIAL_TEST_EQ(filter.mean(), 9.0);
    filter.push(7.0);
    TRIAL_TEST_EQ(filter.mean(), 8.5);
    filter.push(6.0);
    TRIAL_TEST_EQ(filter.mean(), 7.5);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.mean(), 6.5);
}